

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path)

{
  const_iterator intermediate_fields_iter;
  bool bVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  Descriptor *pDVar5;
  long lVar6;
  ulong uVar7;
  reference ppFVar8;
  mapped_type *__x;
  undefined8 *in_RDI;
  Symbol SVar9;
  UnknownFieldSet *in_stack_00000018;
  FieldDescriptor *in_stack_00000020;
  OptionInterpreter *in_stack_00000028;
  int index;
  CodedOutputStream out;
  StringOutputStream outstr;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  reverse_iterator iter;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  string *name_part;
  int i;
  vector<int,_std::allocator<int>_> dest_path;
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  FieldDescriptor *field;
  Descriptor *descriptor;
  Symbol symbol;
  Descriptor *options_descriptor;
  undefined4 in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  OptionInterpreter *in_stack_fffffffffffff8d0;
  CodedOutputStream *in_stack_fffffffffffff8d8;
  undefined7 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e7;
  Descriptor *in_stack_fffffffffffff8e8;
  string *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff8f8;
  DescriptorBuilder *in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff908;
  Type in_stack_fffffffffffff90c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff910;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff918;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff930;
  int in_stack_fffffffffffff934;
  LogMessage *in_stack_fffffffffffff958;
  LogMessage *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96f;
  type in_stack_fffffffffffff970;
  UninterpretedOption *in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff980;
  undefined4 in_stack_fffffffffffff984;
  byte local_5f2;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa19;
  undefined1 in_stack_fffffffffffffa1a;
  undefined1 in_stack_fffffffffffffa1b;
  CppType in_stack_fffffffffffffa1c;
  int in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa24;
  int in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  const_iterator in_stack_fffffffffffffa30;
  undefined7 in_stack_fffffffffffffa38;
  undefined1 in_stack_fffffffffffffa3f;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [36];
  int local_37c;
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [36];
  int local_1b4;
  Type local_1b0;
  undefined4 uStack_1ac;
  anon_union_8_8_13f84498_for_Symbol_2 aStack_1a8;
  string local_1a0 [32];
  string local_180 [32];
  string *local_160;
  int local_154;
  allocator local_131;
  string local_130 [56];
  anon_union_8_8_13f84498_for_Symbol_2 local_f8;
  anon_union_8_8_13f84498_for_Symbol_2 local_f0;
  byte local_e1;
  Symbol local_a8;
  anon_union_8_8_13f84498_for_Symbol_2 local_90;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [71];
  byte local_1;
  
  iVar2 = UninterpretedOption::name_size((UninterpretedOption *)0x4cd910);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Option must have a name.",&local_49);
    local_1 = AddNameError(in_stack_fffffffffffff8d0,
                           (string *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  else {
    UninterpretedOption::name
              ((UninterpretedOption *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
    UninterpretedOption_NamePart::name_part_abi_cxx11_((UninterpretedOption_NamePart *)0x4cd9fd);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff8d0,
                            (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_80,"Option must not use reserved name \"uninterpreted_option\".",&local_81);
      local_1 = AddNameError(in_stack_fffffffffffff8d0,
                             (string *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)
                            );
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      local_90 = (anon_union_8_8_13f84498_for_Symbol_2)0x0;
      pDVar5 = Message::GetDescriptor((Message *)in_stack_fffffffffffff8d0);
      Descriptor::full_name_abi_cxx11_(pDVar5);
      SVar9 = FindSymbolNotEnforcingDeps
                        ((DescriptorBuilder *)
                         CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         (string *)in_stack_fffffffffffff8d8,
                         SUB81((ulong)in_stack_fffffffffffff8d0 >> 0x38,0));
      local_a8.field_1 = SVar9.field_1;
      local_a8.type = SVar9.type;
      bVar1 = Symbol::IsNull(&local_a8);
      if ((bVar1) || (local_a8.type != MESSAGE)) {
        local_90.descriptor = Message::GetDescriptor((Message *)in_stack_fffffffffffff8d0);
      }
      else {
        local_90 = local_a8.field_1;
      }
      local_e1 = 0;
      if (local_90.descriptor == (Descriptor *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                   (char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
        local_e1 = 1;
        internal::LogMessage::operator<<
                  ((LogMessage *)in_stack_fffffffffffff8d0,
                   (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffff8d0,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
      }
      if ((local_e1 & 1) != 0) {
        internal::LogMessage::~LogMessage((LogMessage *)0x4cdc0e);
      }
      local_f0 = local_90;
      local_f8.descriptor = (Descriptor *)0x0;
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)0x4cdc37);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,anon_var_dwarf_29c033 + 0x11,&local_131);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::vector<int,_std::allocator<int>_>::vector
                (in_stack_fffffffffffff920,in_stack_fffffffffffff918);
      for (local_154 = 0; iVar2 = local_154,
          iVar3 = UninterpretedOption::name_size((UninterpretedOption *)0x4cdcb8), iVar2 < iVar3;
          local_154 = local_154 + 1) {
        UninterpretedOption::name
                  ((UninterpretedOption *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
        local_160 = UninterpretedOption_NamePart::name_part_abi_cxx11_
                              ((UninterpretedOption_NamePart *)0x4cdd06);
        lVar6 = std::__cxx11::string::size();
        if (lVar6 != 0) {
          std::__cxx11::string::operator+=(local_130,".");
        }
        UninterpretedOption::name
                  ((UninterpretedOption *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
        bVar1 = UninterpretedOption_NamePart::is_extension((UninterpretedOption_NamePart *)0x4cde0b)
        ;
        if (bVar1) {
          std::operator+((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
          std::__cxx11::string::operator+=(local_130,local_180);
          std::__cxx11::string::~string(local_180);
          std::__cxx11::string::~string(local_1a0);
          SVar9 = LookupSymbol(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,
                               in_stack_fffffffffffff8f0,
                               (PlaceholderType)((ulong)in_stack_fffffffffffff8e8 >> 0x20),
                               (ResolveMode)in_stack_fffffffffffff8e8,
                               (bool)in_stack_fffffffffffff8e7);
          aStack_1a8 = SVar9.field_1;
          local_1b0 = SVar9.type;
          local_a8._4_4_ = uStack_1ac;
          local_a8.type = local_1b0;
          local_a8.field_1 = aStack_1a8;
          bVar1 = Symbol::IsNull(&local_a8);
          if ((!bVar1) && (local_a8.type == FIELD)) {
            local_f8 = local_a8.field_1;
          }
        }
        else {
          std::__cxx11::string::operator+=(local_130,(string *)local_160);
          local_f8.field_descriptor =
               Descriptor::FindFieldByName
                         (in_stack_fffffffffffff8e8,
                          (string *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
        }
        if (local_f8.descriptor == (Descriptor *)0x0) {
          bVar1 = get_allow_unknown(*(DescriptorPool **)*in_RDI);
          if (bVar1) {
            AddWithoutInterpreting
                      ((OptionInterpreter *)
                       CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                       in_stack_fffffffffffff978,(Message *)in_stack_fffffffffffff970);
            local_1 = 1;
            local_1b4 = 1;
          }
          else {
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              std::operator+((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
              std::__cxx11::string::substr((ulong)local_298,(ulong)local_130);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff900);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
              local_1 = AddNameError(in_stack_fffffffffffff8d0,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
              std::__cxx11::string::~string(local_1d8);
              std::__cxx11::string::~string(local_1f8);
              std::__cxx11::string::~string(local_298);
              std::__cxx11::string::~string(local_218);
              std::__cxx11::string::~string(local_238);
              std::__cxx11::string::~string(local_258);
              std::__cxx11::string::~string(local_278);
              local_1b4 = 1;
            }
            else {
              std::operator+((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
              local_1 = AddNameError(in_stack_fffffffffffff8d0,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
              std::__cxx11::string::~string(local_2b8);
              std::__cxx11::string::~string(local_2d8);
              std::__cxx11::string::~string(local_2f8);
              local_1b4 = 1;
            }
          }
          goto LAB_004cf194;
        }
        pDVar5 = FieldDescriptor::containing_type(local_f8.field_descriptor);
        if (pDVar5 != local_f0.descriptor) {
          pDVar5 = FieldDescriptor::containing_type(local_f8.field_descriptor);
          bVar1 = get_is_placeholder(pDVar5);
          if (bVar1) {
            AddWithoutInterpreting
                      ((OptionInterpreter *)
                       CONCAT44(in_stack_fffffffffffff984,in_stack_fffffffffffff980),
                       in_stack_fffffffffffff978,(Message *)in_stack_fffffffffffff970);
            local_1 = 1;
            local_1b4 = 1;
          }
          else {
            std::operator+((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
            Descriptor::name_abi_cxx11_(local_f0.descriptor);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d0);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
            local_1 = AddNameError(in_stack_fffffffffffff8d0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
            std::__cxx11::string::~string(local_318);
            std::__cxx11::string::~string(local_338);
            std::__cxx11::string::~string(local_358);
            std::__cxx11::string::~string(local_378);
            local_1b4 = 1;
          }
          goto LAB_004cf194;
        }
        in_stack_fffffffffffffa28 = FieldDescriptor::number(local_f8.field_descriptor);
        local_37c = in_stack_fffffffffffffa28;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8d0,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        in_stack_fffffffffffffa20 = local_154;
        in_stack_fffffffffffffa24 = UninterpretedOption::name_size((UninterpretedOption *)0x4ce67f);
        if (in_stack_fffffffffffffa20 < in_stack_fffffffffffffa24 + -1) {
          in_stack_fffffffffffffa1c = FieldDescriptor::cpp_type((FieldDescriptor *)0x4ce6ae);
          if (in_stack_fffffffffffffa1c != CPPTYPE_MESSAGE) {
            std::operator+((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
            local_1 = AddNameError(in_stack_fffffffffffff8d0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
            std::__cxx11::string::~string(local_3a0);
            std::__cxx11::string::~string(local_3c0);
            local_1b4 = 1;
            goto LAB_004cf194;
          }
          in_stack_fffffffffffffa1a = FieldDescriptor::is_repeated((FieldDescriptor *)0x4ce7b1);
          if ((bool)in_stack_fffffffffffffa1a) {
            std::operator+((char *)in_stack_fffffffffffff918,in_stack_fffffffffffff910);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
            local_1 = AddNameError(in_stack_fffffffffffff8d0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
            std::__cxx11::string::~string(local_3e0);
            std::__cxx11::string::~string(local_400);
            local_1b4 = 1;
            goto LAB_004cf194;
          }
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                      (value_type *)in_stack_fffffffffffff8d8);
          in_stack_fffffffffffffa10.descriptor =
               FieldDescriptor::message_type((FieldDescriptor *)in_stack_fffffffffffff8d0);
          local_f0.descriptor = in_stack_fffffffffffffa10.descriptor;
        }
      }
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4ce912);
      local_5f2 = 0;
      if (!bVar1) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        __gnu_cxx::
        __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
        ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                  ((__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    *)in_stack_fffffffffffff8d0,
                   (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        __gnu_cxx::
        __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
        ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                  ((__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    *)in_stack_fffffffffffff8d0,
                   (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        Message::GetReflection((Message *)in_stack_fffffffffffff8d0);
        Reflection::GetUnknownFields
                  ((Reflection *)in_stack_fffffffffffff8d0,
                   (Message *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        intermediate_fields_iter._M_current._7_1_ = in_stack_fffffffffffffa3f;
        intermediate_fields_iter._M_current._0_7_ = in_stack_fffffffffffffa38;
        bVar1 = ExamineIfOptionIsSet
                          ((OptionInterpreter *)
                           CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                           intermediate_fields_iter,in_stack_fffffffffffffa30,
                           (FieldDescriptor *)
                           CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                           (string *)
                           CONCAT44(in_stack_fffffffffffffa1c,
                                    CONCAT13(in_stack_fffffffffffffa1b,
                                             CONCAT12(in_stack_fffffffffffffa1a,
                                                      CONCAT11(in_stack_fffffffffffffa19,
                                                               in_stack_fffffffffffffa18)))),
                           (UnknownFieldSet *)in_stack_fffffffffffffa10.descriptor);
        local_5f2 = bVar1 ^ 0xff;
      }
      if ((local_5f2 & 1) == 0) {
        operator_new(0x18);
        UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)0x4cea6c);
        std::
        unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
        ::unique_ptr<std::default_delete<google::protobuf::UnknownFieldSet>,void>
                  ((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                    *)in_stack_fffffffffffff8d0,
                   (pointer)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        std::
        unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
        ::get((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
               *)in_stack_fffffffffffff8d0);
        bVar1 = SetOptionValue(in_stack_00000028,in_stack_00000020,in_stack_00000018);
        if (bVar1) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::rbegin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)in_stack_fffffffffffff8d8);
          while( true ) {
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::rend((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)in_stack_fffffffffffff8d8);
            bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                     *)in_stack_fffffffffffff8d0,
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)
                                   );
            if (!bVar1) break;
            operator_new(0x18);
            UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)0x4cebae);
            std::
            unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
            ::unique_ptr<std::default_delete<google::protobuf::UnknownFieldSet>,void>
                      ((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                        *)in_stack_fffffffffffff8d0,
                       (pointer)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         *)in_stack_fffffffffffff8d0);
            TVar4 = FieldDescriptor::type
                              ((FieldDescriptor *)
                               CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
            if (TVar4 == TYPE_GROUP) {
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ::operator->((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                            *)0x4ceeca);
              ppFVar8 = std::
                        reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                     *)in_stack_fffffffffffff8d0);
              in_stack_fffffffffffff934 = FieldDescriptor::number(*ppFVar8);
              UnknownFieldSet::AddGroup
                        ((UnknownFieldSet *)in_stack_fffffffffffff900,
                         (int)((ulong)in_stack_fffffffffffff8f8 >> 0x20));
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                           *)in_stack_fffffffffffff8d0);
              UnknownFieldSet::MergeFrom
                        ((UnknownFieldSet *)
                         CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                         (UnknownFieldSet *)in_stack_fffffffffffff8d8);
LAB_004cf005:
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ::release((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                         *)0x4cf012);
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ::reset((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       *)in_stack_fffffffffffff8d0,
                      (pointer)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
              local_1b4 = 0;
            }
            else {
              if (TVar4 == TYPE_MESSAGE) {
                std::
                unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                ::operator->((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                              *)0x4cec64);
                ppFVar8 = std::
                          reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                       *)in_stack_fffffffffffff8d0);
                FieldDescriptor::number(*ppFVar8);
                UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                          ((UnknownFieldSet *)in_stack_fffffffffffff8f0,
                           (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
                io::StringOutputStream::StringOutputStream
                          ((StringOutputStream *)in_stack_fffffffffffff8d0,
                           (string *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)in_stack_fffffffffffff8d0,
                           (ZeroCopyOutputStream *)
                           CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
                in_stack_fffffffffffff970 =
                     std::
                     unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                     ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                  *)in_stack_fffffffffffff8d0);
                internal::WireFormat::SerializeUnknownFields
                          ((UnknownFieldSet *)
                           CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                           in_stack_fffffffffffff8d8);
                in_stack_fffffffffffff96f =
                     io::CodedOutputStream::HadError
                               ((CodedOutputStream *)
                                CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930));
                if ((bool)in_stack_fffffffffffff96f) {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)
                             CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                             (LogLevel_conflict)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                             (char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
                  in_stack_fffffffffffff960 =
                       internal::LogMessage::operator<<
                                 ((LogMessage *)in_stack_fffffffffffff8d0,
                                  (char *)CONCAT44(in_stack_fffffffffffff8cc,
                                                   in_stack_fffffffffffff8c8));
                  in_stack_fffffffffffff958 =
                       internal::LogMessage::operator<<
                                 ((LogMessage *)in_stack_fffffffffffff8d0,
                                  (char *)CONCAT44(in_stack_fffffffffffff8cc,
                                                   in_stack_fffffffffffff8c8));
                  internal::LogMessage::operator<<
                            ((LogMessage *)in_stack_fffffffffffff8d0,
                             (string *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)
                            );
                  internal::LogMessage::operator<<
                            ((LogMessage *)in_stack_fffffffffffff8d0,
                             (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
                  internal::LogFinisher::operator=
                            ((LogFinisher *)in_stack_fffffffffffff8d0,
                             (LogMessage *)
                             CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
                  internal::LogMessage::~LogMessage((LogMessage *)0x4cee19);
                }
                local_1b4 = 8;
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)0x4cee31);
                io::StringOutputStream::~StringOutputStream((StringOutputStream *)0x4cee3e);
                goto LAB_004cf005;
              }
              internal::LogMessage::LogMessage
                        ((LogMessage *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0)
                         ,(LogLevel_conflict)((ulong)in_stack_fffffffffffff8d8 >> 0x20),
                         (char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc);
              internal::LogMessage::operator<<
                        ((LogMessage *)in_stack_fffffffffffff8d0,
                         (char *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
              in_stack_fffffffffffff910 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                *)in_stack_fffffffffffff8d0);
              in_stack_fffffffffffff90c =
                   FieldDescriptor::type
                             ((FieldDescriptor *)
                              CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
              in_stack_fffffffffffff900 =
                   (DescriptorBuilder *)
                   internal::LogMessage::operator<<
                             (in_stack_fffffffffffff960,
                              (int)((ulong)in_stack_fffffffffffff958 >> 0x20));
              internal::LogFinisher::operator=
                        ((LogFinisher *)in_stack_fffffffffffff8d0,
                         (LogMessage *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8)
                        );
              internal::LogMessage::~LogMessage((LogMessage *)0x4cefcd);
              local_1 = 0;
              local_1b4 = 1;
            }
            std::
            unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
            ::~unique_ptr((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                           *)in_stack_fffffffffffff8d0);
            if (local_1b4 != 0) goto LAB_004cf176;
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          *)in_stack_fffffffffffff8d0);
          }
          Message::GetReflection((Message *)in_stack_fffffffffffff8d0);
          Reflection::MutableUnknownFields
                    ((Reflection *)in_stack_fffffffffffff8d0,
                     (Message *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
          std::
          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
          ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       *)in_stack_fffffffffffff8d0);
          UnknownFieldSet::MergeFrom
                    ((UnknownFieldSet *)
                     CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),
                     (UnknownFieldSet *)in_stack_fffffffffffff8d8);
          in_stack_fffffffffffff8e7 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4cf0d2);
          if ((bool)in_stack_fffffffffffff8e7) {
            __x = std::
                  map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  ::operator[]((map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                                *)in_stack_fffffffffffff910,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
            *__x = *__x + 1;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0),__x);
          }
          in_stack_fffffffffffff8d0 =
               (OptionInterpreter *)
               std::
               map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)in_stack_fffffffffffff910,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970,
                     (vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968));
          local_1 = 1;
          local_1b4 = 1;
        }
        else {
          local_1 = 0;
          local_1b4 = 1;
        }
LAB_004cf176:
        std::
        unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
        ::~unique_ptr((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       *)in_stack_fffffffffffff8d0);
      }
      else {
        local_1 = 0;
        local_1b4 = 1;
      }
LAB_004cf194:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
      std::__cxx11::string::~string(local_130);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)CONCAT17(in_stack_fffffffffffff8e7,in_stack_fffffffffffff8e0));
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError(
        "Option must not use reserved name "
        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError(
            "Option \"" + debug_msg_name +
            "\" unknown. Ensure that your proto" +
            " definition file imports the proto which defines the option.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError("Option \"" + debug_msg_name +
                              "\" is an atomic type, not a message.");
        } else if (field->is_repeated()) {
          return AddNameError("Option field \"" + debug_msg_name +
                              "\" is a repeated message. Repeated message "
                              "options must be initialized using an "
                              "aggregate value.");
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}